

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilesBoard.cpp
# Opt level: O1

void __thiscall
TilesBoard::createTiles(TilesBoard *this,size_t boardSize,size_t tileSize,QMainWindow *window)

{
  __single_object _Var1;
  vector<QHBoxLayout*,std::allocator<QHBoxLayout*>> *pvVar2;
  undefined8 uVar3;
  QHBoxLayout *this_00;
  __uniq_ptr_data<QPushButton,_std::default_delete<QPushButton>,_true,_true> this_01;
  undefined4 *puVar4;
  size_t sVar5;
  size_t sVar6;
  __single_object tile;
  QString t;
  QArrayData *local_a8;
  char16_t *local_a0;
  qsizetype qStack_98;
  vector<QHBoxLayout*,std::allocator<QHBoxLayout*>> *local_90;
  size_t local_88;
  function<void_()> *local_80;
  QMainWindow *local_78;
  _Any_data local_70;
  code *local_60;
  undefined8 uStack_58;
  QObject local_50 [8];
  QArrayData *local_48 [3];
  
  local_78 = window;
  deleteTiles(this);
  QBoxLayout::addStretch((int)this->verticalLayout);
  local_88 = boardSize;
  if (boardSize != 0) {
    local_90 = (vector<QHBoxLayout*,std::allocator<QHBoxLayout*>> *)&this->horizontalLayouts;
    local_80 = &this->pressTileSlot;
    sVar5 = 0;
    do {
      this_00 = (QHBoxLayout *)operator_new(0x20);
      QHBoxLayout::QHBoxLayout(this_00);
      pvVar2 = local_90;
      t.d.d = (Data *)this_00;
      std::vector<QHBoxLayout*,std::allocator<QHBoxLayout*>>::emplace_back<QHBoxLayout*>
                (local_90,(QHBoxLayout **)&t);
      (**(code **)(**(long **)(*(long *)pvVar2 + sVar5 * 8) + 0x68))();
      QBoxLayout::addStretch((int)*(undefined8 *)(*(long *)pvVar2 + sVar5 * 8));
      sVar6 = 0;
      do {
        this_01.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
        super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
        super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
             (__uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>)operator_new(0x28);
        QPushButton::QPushButton
                  ((QPushButton *)
                   this_01.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
                   _M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                   super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl,(QWidget *)0x0);
        tile._M_t.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
        super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
        super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
             (__uniq_ptr_data<QPushButton,_std::default_delete<QPushButton>,_true,_true>)
             (__uniq_ptr_data<QPushButton,_std::default_delete<QPushButton>,_true,_true>)
             this_01.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
             super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
             super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl;
        QString::number((ulong)&local_a8,(int)sVar5);
        QString::number((ulong)local_48,(int)sVar6);
        t.d.d = (Data *)local_a8;
        t.d.ptr = local_a0;
        t.d.size = qStack_98;
        if (local_a8 != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&local_a8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&local_a8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::append(&t);
        QWidget::setAccessibleName
                  ((QString *)
                   this_01.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
                   _M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                   super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
        if (t.d.d != (Data *)0x0) {
          LOCK();
          ((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(t.d.d)->super_QArrayData,2,8);
          }
        }
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,8);
          }
        }
        if (local_a8 != (QArrayData *)0x0) {
          LOCK();
          (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a8,2,8);
          }
        }
        QWidget::setMaximumSize
                  ((int)tile._M_t.
                        super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
                        super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                        super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl,(int)tileSize);
        QWidget::setMinimumSize
                  ((int)tile._M_t.
                        super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
                        super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                        super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl,(int)tileSize);
        _Var1 = tile;
        std::function<void_()>::function((function<void_()> *)&local_70,local_80);
        local_a8 = (QArrayData *)QAbstractButton::clicked;
        local_a0 = (char16_t *)0x0;
        puVar4 = (undefined4 *)operator_new(0x30);
        uVar3 = uStack_58;
        t.d.d = (Data *)0x0;
        t.d.ptr = (char16_t *)0x0;
        t.d.size = 0;
        if (local_60 != (code *)0x0) {
          t.d.d = (Data *)local_70._M_unused._0_8_;
          t.d.ptr = (char16_t *)local_70._8_8_;
          t.d.size = (qsizetype)local_60;
          local_60 = (code *)0x0;
          uStack_58 = 0;
        }
        *puVar4 = 1;
        *(code **)(puVar4 + 2) =
             QtPrivate::QFunctorSlotObject<std::function<void_()>,_0,_QtPrivate::List<>,_void>::impl
        ;
        *(undefined8 *)(puVar4 + 4) = 0;
        *(undefined8 *)(puVar4 + 6) = 0;
        *(undefined8 *)(puVar4 + 8) = 0;
        *(undefined8 *)(puVar4 + 10) = uVar3;
        if (t.d.size != 0) {
          *(Data **)(puVar4 + 4) = t.d.d;
          *(char16_t **)(puVar4 + 6) = t.d.ptr;
          *(qsizetype *)(puVar4 + 8) = t.d.size;
          t.d.size = 0;
        }
        QObject::connectImpl
                  (local_50,(void **)_Var1._M_t.
                                     super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>
                                     .super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl,
                   (QObject *)&local_a8,(void **)local_78,(QSlotObjectBase *)0x0,
                   (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
        if (t.d.size != 0) {
          (*(code *)t.d.size)(&t,&t,3);
        }
        QMetaObject::Connection::~Connection((Connection *)local_50);
        if (local_60 != (code *)0x0) {
          (*local_60)(&local_70,&local_70,__destroy_functor);
        }
        QBoxLayout::addWidget
                  (*(undefined8 *)(*(long *)local_90 + sVar5 * 8),
                   tile._M_t.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
                   _M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                   super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl,0,0);
        std::
        vector<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>,std::allocator<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>>>
        ::emplace_back<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>>
                  ((vector<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>,std::allocator<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>>>
                    *)this,&tile);
        if ((__uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>)
            tile._M_t.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
            super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
            super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>)0x0) {
          (**(code **)(*(long *)tile._M_t.
                                super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>
                                .super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl + 0x20))()
          ;
        }
        sVar6 = sVar6 + 1;
      } while (local_88 != sVar6);
      QBoxLayout::addStretch
                ((int)(this->horizontalLayouts).
                      super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar5]);
      QBoxLayout::addLayout
                ((QLayout *)this->verticalLayout,
                 (int)(this->horizontalLayouts).
                      super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar5]);
      sVar5 = sVar5 + 1;
    } while (sVar5 != local_88);
  }
  QBoxLayout::addStretch((int)this->verticalLayout);
  return;
}

Assistant:

void TilesBoard::createTiles( size_t boardSize, size_t tileSize, QMainWindow* window )
{
    deleteTiles();
    verticalLayout->addStretch();

    for ( size_t row = 0; row < boardSize; row++ )
    {
        horizontalLayouts.emplace_back( new QHBoxLayout() );
        horizontalLayouts[row]->setSpacing(0);
        horizontalLayouts[row]->addStretch();

        for ( size_t col = 0; col < boardSize; col++ )
        {
            auto tile = std::make_unique<QPushButton>();
            tile->setAccessibleName( QString::number( row ) + QString::number( col ));
            tile->setMaximumSize( tileSize, tileSize );
            tile->setMinimumSize( tileSize, tileSize );
            QObject::connect( tile.get(), &QPushButton::clicked, window, pressTileSlot );
            horizontalLayouts[row]->addWidget( tile.get() );
            tiles.push_back( std::move( tile ));
        }

        horizontalLayouts[row]->addStretch();
        verticalLayout->addLayout( horizontalLayouts[row] );
    }
    verticalLayout->addStretch();
}